

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

void __thiscall catalog::LoadIM_RM(catalog *this,IndexManager *IM,RecordManager *RM)

{
  TableInfo *pTVar1;
  pointer ppTVar2;
  _Base_ptr p_Var3;
  long lVar4;
  _Self __tmp;
  ulong uVar5;
  vector<IndexInfo,_std::allocator<IndexInfo>_> IndexList;
  vector<TableInfo,_std::allocator<TableInfo>_> TS;
  vector<IndexInfo,_std::allocator<IndexInfo>_> local_e8;
  undefined1 local_c8 [8];
  _Alloc_hider _Stack_c0;
  pointer local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  vector<TableInfo,_std::allocator<TableInfo>_> local_60;
  vector<IndexInfo,_std::allocator<IndexInfo>_> local_48;
  
  local_e8.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_e8.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  for (lVar4 = 0; lVar4 < this->tableNumber; lVar4 = lVar4 + 1) {
    pTVar1 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar4];
    p_Var3 = *(_Base_ptr *)((long)&(pTVar1->indexInfo)._M_t._M_impl + 0x18);
    while (p_Var3 != (_Rb_tree_node_base *)((long)&(pTVar1->indexInfo)._M_t._M_impl + 8U)) {
      _Stack_c0._M_p = (pointer)&local_b0;
      local_b8 = (pointer)0x0;
      local_b0._M_local_buf[0] = '\0';
      local_a0._M_p = (pointer)&local_90;
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_78 = 0;
      local_70._M_local_buf[0] = '\0';
      local_80._M_p = (pointer)&local_70;
      std::__cxx11::string::_M_assign((string *)&local_a0);
      std::__cxx11::string::_M_assign((string *)&_Stack_c0);
      local_c8._4_4_ =
           *(int *)(*(long *)&(pTVar1->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + (long)(int)p_Var3[1]._M_color * 4);
      std::vector<IndexInfo,_std::allocator<IndexInfo>_>::push_back(&local_e8,(IndexInfo *)local_c8)
      ;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      IndexInfo::~IndexInfo((IndexInfo *)local_c8);
    }
  }
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::vector(&local_48,&local_e8);
  IndexManager::LoadAllBpTree(IM,&local_48);
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::~vector(&local_48);
  local_c8 = (undefined1  [8])0x0;
  _Stack_c0._M_p = (pointer)0x0;
  local_b8 = (pointer)0x0;
  for (uVar5 = 0;
      ppTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->TableInfoList).
                            super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3);
      uVar5 = uVar5 + 1) {
    std::vector<TableInfo,_std::allocator<TableInfo>_>::push_back
              ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8,ppTVar2[uVar5]);
  }
  std::vector<TableInfo,_std::allocator<TableInfo>_>::vector
            (&local_60,(vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8);
  RecordManager::LoadAllRecordSet(RM,&local_60);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::~vector(&local_60);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::~vector
            ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8);
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::~vector(&local_e8);
  return;
}

Assistant:

void catalog::LoadIM_RM(IndexManager& IM,RecordManager& RM){
    //load bptree record
    std::vector<IndexInfo> IndexList;
    for(int i = 0 ; i < tableNumber ; i ++){
        TableInfo* T = TableInfoList[i];
        auto it = T->indexInfo.begin();
        while(it!=T->indexInfo.end()){
            IndexInfo i;
            i.tableName = T->tableName;
            i.indexName = it->second;
            i.type = T->type[it->first];
            IndexList.push_back(i);
            it++;
        }
    }
    IM.LoadAllBpTree(IndexList);
    std::vector<TableInfo> TS;
    for(int i = 0 ; i < TableInfoList.size();i++){
        TS.push_back(*(TableInfoList[i]));
    }
    RM.LoadAllRecordSet(TS);
}